

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::(anonymous_namespace)::(anonymous_namespace)::
     ArrayValueToVertexAttribute<std::vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>>
               (Value *value,string *name,uint32_t elementSize,VertexVariability variability,
               uint32_t num_vertices,uint32_t num_face_counts,uint32_t num_face_vertex_indices,
               VertexAttributeFormat format,VertexAttribute *dst,string *err)

{
  vtable_type *pvVar1;
  undefined1 uVar2;
  vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *pvVar3;
  ostream *poVar4;
  undefined4 in_register_00000084;
  size_t value_counts;
  ostringstream ss_e;
  string local_240;
  long *local_220 [2];
  long local_210 [2];
  string *local_200;
  size_t local_1f8;
  VertexVariability local_1f0;
  uint32_t local_1ec;
  string local_1e8;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_200 = name;
  local_1f0 = variability;
  local_1ec = elementSize;
  local_1f8 = tinyusdz::value::Value::array_size(value);
  if (local_1f8 == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ArrayValueToVertexAttribute",0x1b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x4b5);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Empty array size",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (dst == (VertexAttribute *)0x0) goto LAB_00372f09;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)dst,(ulong)local_240._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p == &local_240.field_2) goto LAB_00372f09;
  }
  else {
    tinyusdz::value::Value::
    as<std::vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>>
              (value,false);
    pvVar3 = tinyusdz::value::Value::
             as<std::vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>>
                       (value,false);
    if (pvVar3 != (vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                  0x0) {
      uVar2 = (*(code *)(&DAT_005e1420 + *(int *)(&DAT_005e1420 + (ulong)local_1f0 * 4)))();
      return (bool)uVar2;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ArrayValueToVertexAttribute",0x1b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x50a);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    local_220[0] = local_210;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_220,
               "Requested underlying type {} but input `value` has underlying type {}.","");
    tinyusdz::value::
    TypeTraits<std::vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>>::
    type_name_abi_cxx11_();
    pvVar1 = (value->v_).vtable;
    if (pvVar1 == (vtable_type *)0x0) {
      local_1e8.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
      local_1e8._M_string_length = 4;
      local_1e8.field_2._M_allocated_capacity._4_4_ =
           local_1e8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      (*pvVar1->underlying_type_name)(&local_1e8);
    }
    fmt::format<std::__cxx11::string,std::__cxx11::string>
              (&local_240,(fmt *)local_220,&local_1c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000084,num_vertices));
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT44(local_1e8.field_2._M_allocated_capacity._4_4_,
                               local_1e8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (local_220[0] != local_210) {
      operator_delete(local_220[0],local_210[0] + 1);
    }
    if (dst == (VertexAttribute *)0x0) goto LAB_00372f09;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)dst,(ulong)local_240._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p == &local_240.field_2) goto LAB_00372f09;
  }
  operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
LAB_00372f09:
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool ArrayValueToVertexAttribute(
    const value::Value &value, const std::string &name,
    const uint32_t elementSize, const VertexVariability variability,
    const uint32_t num_vertices, const uint32_t num_face_counts,
    const uint32_t num_face_vertex_indices, const VertexAttributeFormat format,
    VertexAttribute &dst, std::string *err) {
  if (!value::TypeTraits<UnderlyingTy>::is_array()) {
    PUSH_ERROR_AND_RETURN(
        "[Internal error] UnderlyingTy template parameter must be array type.");
  }

  size_t baseTySize = value::TypeTraits<UnderlyingTy>::size();

  size_t value_counts = value.array_size();
  if (value_counts == 0) {
    PUSH_ERROR_AND_RETURN("Empty array size");
  }

  if (variability == VertexVariability::Indexed) {
    PUSH_ERROR_AND_RETURN("Indexed variability is not supported.");
  }

  if (VertexAttributeFormatSize(format) != baseTySize) {
    PUSH_ERROR_AND_RETURN("format size mismatch. expected "
                          << VertexAttributeFormatSize(format) << " but got "
                          << baseTySize);
    return false;
  }

  DCOUT("value.type = " << value.type_name());
  DCOUT("UnderlyingTy = " << value::TypeTraits<UnderlyingTy>::type_name());
  const auto p = value.as<UnderlyingTy>();
  if (!p) {
    DCOUT("p is nullptr");
  }

  if (auto pv = value.as<UnderlyingTy>()) {
    switch (variability) {
    case VertexVariability::Constant: {
      if (value_counts != elementSize) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "{} # of items {} expected, but got {}. Variability = Constant",
            name, elementSize, value_counts));
      }
      break;
    }
    case VertexVariability::Uniform: {
      if (value_counts != (elementSize * num_face_counts)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "{} # of items {} expected, but got {}. Variability = Uniform",
            name, elementSize * num_face_counts, value_counts));
      }
      break;
    }
    case VertexVariability::Vertex: {
      if (value_counts != (elementSize * num_vertices)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "{} # of items {} expected, but got {}. Variability = Vertex",
            name, elementSize * num_vertices, value_counts));
      }
      break;
    case VertexVariability::Varying: {
      if (value_counts != (elementSize * num_vertices)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "{} # of items {} expected, but got {}. Variability = Varying",
            name, elementSize * num_vertices, value_counts));
      }
      break;
    }
    case VertexVariability::FaceVarying: {
      if (value_counts != (elementSize * num_face_vertex_indices)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "# of items {} expected, but got {}. Variability = FaceVarying",
            elementSize * num_face_vertex_indices, value_counts));
      }
      break;
    }
    case VertexVariability::Indexed: {
      PUSH_ERROR_AND_RETURN(fmt::format(
            "{} Internal error. 'Indexed' variability is not supported."));
      }
      break;
    }
    }

    dst.data.resize(value_counts * baseTySize);
    memcpy(dst.data.data(), pv->data(), value_counts * baseTySize);

    dst.elementSize = elementSize;
    dst.stride = 0;
    dst.format = format;
    dst.variability = variability;
    dst.name = name;
    dst.indices.clear();
    return true;
  }

  PUSH_ERROR_AND_RETURN(fmt::format(
      "Requested underlying type {} but input `value` has underlying type {}.",
      value::TypeTraits<UnderlyingTy>::type_name(),
      value.underlying_type_name()));
}